

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coap.cpp
# Opt level: O0

void __thiscall
ot::commissioner::coap::Coap::SendRequest(Coap *this,Request *aRequest,ResponseHandler *aHandler)

{
  bool bVar1;
  uint16_t uVar2;
  element_type *peVar3;
  Error *aError;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  basic_string_view<char> bVar4;
  format_args args;
  string_view fmt;
  bool local_24a;
  Error local_1e8;
  ErrorCode local_1bc;
  function<void_(const_ot::commissioner::coap::Message_*,_ot::commissioner::Error)> local_1b8;
  ErrorCode local_194;
  Error local_190;
  anon_class_1_0_00000001 local_162;
  v10 local_161;
  Endpoint *local_160;
  size_t local_158;
  string local_150;
  Error local_130;
  undefined1 local_f8 [8];
  shared_ptr<ot::commissioner::coap::Message> request;
  Error error;
  ResponseHandler *aHandler_local;
  Request *aRequest_local;
  Coap *this_local;
  undefined1 local_98 [24];
  ulong local_80;
  Endpoint *local_78;
  size_t sStack_70;
  string *local_68;
  v10 *local_60;
  Endpoint **local_58;
  Endpoint **local_50;
  Endpoint *local_48;
  size_t sStack_40;
  Coap **local_38;
  undefined1 *local_30;
  Coap **local_28;
  undefined8 local_20;
  undefined1 *local_18;
  Coap **local_10;
  
  Error::Error((Error *)&request.
                         super___shared_ptr<ot::commissioner::coap::Message,_(__gnu_cxx::_Lock_policy)2>
                         ._M_refcount);
  std::make_shared<ot::commissioner::coap::Message,ot::commissioner::coap::Message_const&>
            ((Message *)local_f8);
  peVar3 = std::
           __shared_ptr_access<ot::commissioner::coap::Message,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<ot::commissioner::coap::Message,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_f8);
  bVar1 = Message::IsConfirmable(peVar3);
  if (!bVar1) {
    peVar3 = std::
             __shared_ptr_access<ot::commissioner::coap::Message,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<ot::commissioner::coap::Message,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_f8);
    bVar1 = Message::IsNonConfirmable(peVar3);
    if (!bVar1) {
      SendRequest::anon_class_1_0_00000001::operator()(&local_162);
      local_58 = &local_160;
      local_60 = &local_161;
      bVar4 = ::fmt::v10::operator()(local_60);
      local_158 = bVar4.size_;
      local_160 = (Endpoint *)bVar4.data_;
      ::fmt::v10::detail::check_format_string<FMT_COMPILE_STRING,_0>();
      local_68 = &local_150;
      local_78 = local_160;
      sStack_70 = local_158;
      local_50 = &local_78;
      local_98._16_8_ = local_160;
      local_80 = local_158;
      local_48 = (Endpoint *)local_98._16_8_;
      sStack_40 = local_80;
      this_local = (Coap *)::fmt::v10::
                           make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>>
                                     ();
      local_30 = local_98;
      local_38 = &this_local;
      local_20 = 0;
      args.field_1.values_ = in_R9.values_;
      args.desc_ = (unsigned_long_long)local_38;
      fmt.size_ = 0;
      fmt.data_ = (char *)local_80;
      local_28 = local_38;
      local_18 = local_30;
      local_10 = local_38;
      ::fmt::v10::vformat_abi_cxx11_(&local_150,(v10 *)local_98._16_8_,fmt,args);
      Error::Error(&local_130,kInvalidArgs,&local_150);
      Error::operator=((Error *)&request.
                                 super___shared_ptr<ot::commissioner::coap::Message,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_refcount,&local_130);
      Error::~Error(&local_130);
      std::__cxx11::string::~string((string *)&local_150);
      goto LAB_002ed43e;
    }
  }
  peVar3 = std::
           __shared_ptr_access<ot::commissioner::coap::Message,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<ot::commissioner::coap::Message,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_f8);
  uVar2 = Message::GetMessageId(peVar3);
  if (uVar2 != 0) {
    abort();
  }
  peVar3 = std::
           __shared_ptr_access<ot::commissioner::coap::Message,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<ot::commissioner::coap::Message,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_f8);
  uVar2 = AllocMessageId(this);
  Message::SetMessageId(peVar3,uVar2);
  peVar3 = std::
           __shared_ptr_access<ot::commissioner::coap::Message,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<ot::commissioner::coap::Message,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_f8);
  Message::SetToken(peVar3,'\b');
  peVar3 = std::
           __shared_ptr_access<ot::commissioner::coap::Message,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator*((__shared_ptr_access<ot::commissioner::coap::Message,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)local_f8);
  Send(&local_190,this,peVar3);
  aError = Error::operator=((Error *)&request.
                                      super___shared_ptr<ot::commissioner::coap::Message,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_refcount,&local_190);
  local_194 = kNone;
  bVar1 = commissioner::operator!=(aError,&local_194);
  Error::~Error(&local_190);
  if (!bVar1) {
    peVar3 = std::
             __shared_ptr_access<ot::commissioner::coap::Message,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<ot::commissioner::coap::Message,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_f8);
    bVar1 = Message::IsConfirmable(peVar3);
    if (bVar1) {
      std::function<void_(const_ot::commissioner::coap::Message_*,_ot::commissioner::Error)>::
      function(&local_1b8,aHandler);
      RequestsCache::Put(&this->mRequestsCache,(RequestPtr *)local_f8,&local_1b8);
      std::function<void_(const_ot::commissioner::coap::Message_*,_ot::commissioner::Error)>::
      ~function(&local_1b8);
    }
  }
LAB_002ed43e:
  local_1bc = kNone;
  bVar1 = commissioner::operator!=
                    ((Error *)&request.
                               super___shared_ptr<ot::commissioner::coap::Message,_(__gnu_cxx::_Lock_policy)2>
                               ._M_refcount,&local_1bc);
  local_24a = false;
  if (bVar1) {
    local_24a = std::operator!=(aHandler,(nullptr_t)0x0);
  }
  if (local_24a != false) {
    Error::Error(&local_1e8,
                 (Error *)&request.
                           super___shared_ptr<ot::commissioner::coap::Message,_(__gnu_cxx::_Lock_policy)2>
                           ._M_refcount);
    std::function<void_(const_ot::commissioner::coap::Message_*,_ot::commissioner::Error)>::
    operator()(aHandler,(Message *)0x0,&local_1e8);
    Error::~Error(&local_1e8);
  }
  std::shared_ptr<ot::commissioner::coap::Message>::~shared_ptr
            ((shared_ptr<ot::commissioner::coap::Message> *)local_f8);
  Error::~Error((Error *)&request.
                          super___shared_ptr<ot::commissioner::coap::Message,_(__gnu_cxx::_Lock_policy)2>
                          ._M_refcount);
  return;
}

Assistant:

void Coap::SendRequest(const Request &aRequest, ResponseHandler aHandler)
{
    Error error;
    auto  request = std::make_shared<Request>(aRequest);

    VerifyOrExit(request->IsConfirmable() || request->IsNonConfirmable(),
                 error = ERROR_INVALID_ARGS("a CoAP request is neither Confirmable nor NON-Confirmable"));

    VerifyOrDie(request->GetMessageId() == 0);
    request->SetMessageId(AllocMessageId());
    request->SetToken(kDefaultTokenLength);

    SuccessOrExit(error = Send(*request));

    if (request->IsConfirmable())
    {
        mRequestsCache.Put(request, aHandler);
    }

exit:
    if (error != ErrorCode::kNone && aHandler != nullptr)
    {
        aHandler(nullptr, error);
    }
}